

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_to_refl_coef.c
# Opt level: O3

void WebRtcSpl_LpcToReflCoef(int16_t *a16,int use_order,int16_t *k16)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  short *psVar5;
  short *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int32_t tmp32 [50];
  uint auStack_f8 [50];
  
  lVar7 = (long)use_order;
  k16[lVar7 + -1] = a16[lVar7] << 3;
  if (1 < use_order) {
    uVar10 = (ulong)(uint)use_order;
    psVar5 = a16 + lVar7;
    do {
      psVar5 = psVar5 + -1;
      lVar8 = lVar7 + -1;
      sVar1 = k16[lVar7 + -1];
      uVar9 = 1;
      psVar6 = psVar5;
      do {
        uVar3 = WebRtcSpl_DivW32W16((uint)(ushort)a16[uVar9] * 0x10000 +
                                    (int)*psVar6 * (int)k16[lVar8] * -2,
                                    (int16_t)(0x3fffffffU - (int)sVar1 * (int)sVar1 >> 0xf));
        auStack_f8[uVar9] = uVar3;
        uVar9 = uVar9 + 1;
        psVar6 = psVar6 + -1;
      } while (uVar10 != uVar9);
      if (2 < lVar7) {
        lVar4 = 0;
        do {
          a16[lVar4 + 1] = (int16_t)(auStack_f8[lVar4 + 1] >> 1);
          lVar4 = lVar4 + 1;
        } while (lVar7 + -2 != lVar4);
      }
      uVar3 = auStack_f8[lVar8];
      if ((int)uVar3 < -0x1ffe) {
        uVar3 = 0xffffe001;
      }
      if (0x1ffe < (int)uVar3) {
        uVar3 = 0x1fff;
      }
      auStack_f8[lVar8] = uVar3;
      k16[lVar7 + -2] = (int16_t)(uVar3 << 2);
      uVar10 = uVar10 - 1;
      bVar2 = 2 < lVar7;
      lVar7 = lVar8;
    } while (bVar2);
  }
  return;
}

Assistant:

void WebRtcSpl_LpcToReflCoef(int16_t* a16, int use_order, int16_t* k16)
{
    int m, k;
    int32_t tmp32[SPL_LPC_TO_REFL_COEF_MAX_AR_MODEL_ORDER];
    int32_t tmp_inv_denom32;
    int16_t tmp_inv_denom16;

    k16[use_order - 1] = a16[use_order] << 3;  // Q12<<3 => Q15
    for (m = use_order - 1; m > 0; m--)
    {
        // (1 - k^2) in Q30
        tmp_inv_denom32 = 1073741823 - k16[m] * k16[m];
        // (1 - k^2) in Q15
        tmp_inv_denom16 = (int16_t)(tmp_inv_denom32 >> 15);

        for (k = 1; k <= m; k++)
        {
            // tmp[k] = (a[k] - RC[m] * a[m-k+1]) / (1.0 - RC[m]*RC[m]);

            // [Q12<<16 - (Q15*Q12)<<1] = [Q28 - Q28] = Q28
            tmp32[k] = (a16[k] << 16) - (k16[m] * a16[m - k + 1] << 1);

            tmp32[k] = WebRtcSpl_DivW32W16(tmp32[k], tmp_inv_denom16); //Q28/Q15 = Q13
        }

        for (k = 1; k < m; k++)
        {
            a16[k] = (int16_t)(tmp32[k] >> 1);  // Q13>>1 => Q12
        }

        tmp32[m] = WEBRTC_SPL_SAT(8191, tmp32[m], -8191);
        k16[m - 1] = (int16_t)WEBRTC_SPL_LSHIFT_W32(tmp32[m], 2); //Q13<<2 => Q15
    }
    return;
}